

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# math.cpp
# Opt level: O0

optional<pbrt::SquareMatrix<3>_> * pbrt::LinearLeastSquares(Float (*A) [3],Float (*B) [3],int rows)

{
  uint uVar1;
  uint uVar2;
  undefined1 auVar3 [16];
  bool bVar4;
  float *pfVar5;
  SquareMatrix<3> *v;
  int in_ECX;
  long in_RDX;
  long in_RSI;
  optional<pbrt::SquareMatrix<3>_> *in_RDI;
  optional<pbrt::SquareMatrix<3>_> AtAi;
  int r;
  int j;
  int i;
  SquareMatrix<3> AtB;
  SquareMatrix<3> AtA;
  SquareMatrix<3> *in_stack_00000278;
  undefined8 in_stack_fffffffffffffeb8;
  SquareMatrix<3> *in_stack_fffffffffffffec0;
  optional<pbrt::SquareMatrix<3>_> *this;
  SquareMatrix<3> *in_stack_fffffffffffffef0;
  undefined4 in_stack_ffffffffffffff38;
  undefined4 in_stack_ffffffffffffff3c;
  SquareMatrix<3> *in_stack_ffffffffffffff40;
  optional<pbrt::SquareMatrix<3>_> local_b8;
  span<float> local_90;
  span<float> local_80;
  int local_70;
  int local_6c;
  int local_68;
  int local_1c;
  long local_18;
  long local_10;
  
  local_1c = in_ECX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  SquareMatrix<3>::Zero();
  SquareMatrix<3>::Zero();
  for (local_68 = 0; local_68 < 3; local_68 = local_68 + 1) {
    for (local_6c = 0; local_6c < 3; local_6c = local_6c + 1) {
      for (local_70 = 0; local_70 < local_1c; local_70 = local_70 + 1) {
        uVar1 = *(uint *)(local_10 + (long)local_70 * 0xc + (long)local_68 * 4);
        uVar2 = *(uint *)(local_10 + (long)local_70 * 0xc + (long)local_6c * 4);
        local_80 = SquareMatrix<3>::operator[]
                             (in_stack_fffffffffffffec0,
                              (int)((ulong)in_stack_fffffffffffffeb8 >> 0x20));
        pfVar5 = pstd::span<float>::operator[](&local_80,(long)local_6c);
        auVar3 = vfmadd213ss_fma(ZEXT416(uVar2),ZEXT416(uVar1),ZEXT416((uint)*pfVar5));
        *pfVar5 = auVar3._0_4_;
        uVar1 = *(uint *)(local_10 + (long)local_70 * 0xc + (long)local_68 * 4);
        uVar2 = *(uint *)(local_18 + (long)local_70 * 0xc + (long)local_6c * 4);
        local_90 = SquareMatrix<3>::operator[]
                             (in_stack_fffffffffffffec0,
                              (int)((ulong)in_stack_fffffffffffffeb8 >> 0x20));
        pfVar5 = pstd::span<float>::operator[](&local_90,(long)local_6c);
        auVar3 = vfmadd213ss_fma(ZEXT416(uVar2),ZEXT416(uVar1),ZEXT416((uint)*pfVar5));
        *pfVar5 = auVar3._0_4_;
      }
    }
  }
  this = &local_b8;
  Inverse<3>(in_stack_00000278);
  bVar4 = pstd::optional::operator_cast_to_bool((optional *)this);
  if (bVar4) {
    v = pstd::optional<pbrt::SquareMatrix<3>_>::operator*
                  ((optional<pbrt::SquareMatrix<3>_> *)0x8b34ac);
    operator*(in_stack_ffffffffffffff40,
              (SquareMatrix<3> *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
    Transpose<3>(in_stack_fffffffffffffef0);
    pstd::optional<pbrt::SquareMatrix<3>_>::optional(this,v);
  }
  else {
    memset(in_RDI,0,0x28);
    pstd::optional<pbrt::SquareMatrix<3>_>::optional(in_RDI);
  }
  pstd::optional<pbrt::SquareMatrix<3>_>::~optional((optional<pbrt::SquareMatrix<3>_> *)0x8b3504);
  return in_RDI;
}

Assistant:

pstd::optional<SquareMatrix<3>> LinearLeastSquares(const Float A[][3], const Float B[][3],
                                                   int rows) {
    SquareMatrix<3> AtA = SquareMatrix<3>::Zero();
    SquareMatrix<3> AtB = SquareMatrix<3>::Zero();

    for (int i = 0; i < 3; ++i)
        for (int j = 0; j < 3; ++j)
            for (int r = 0; r < rows; ++r) {
                AtA[i][j] += A[r][i] * A[r][j];
                AtB[i][j] += A[r][i] * B[r][j];
            }

    auto AtAi = Inverse(AtA);
    if (!AtAi)
        return {};
    return Transpose(*AtAi * AtB);
}